

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUIEnvironment::CGUIEnvironment
          (CGUIEnvironment *this,void **vtt,IFileSystem *fs,IVideoDriver *driver,IOSOperator *op)

{
  int *piVar1;
  _func_int **pp_Var2;
  long lVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  int iVar5;
  int iVar6;
  rect<int> local_40;
  
  pp_Var2 = (_func_int **)vtt[1];
  (this->super_IGUIEnvironment)._vptr_IGUIEnvironment = pp_Var2;
  *(void **)((long)&(this->super_IGUIEnvironment)._vptr_IGUIEnvironment + (long)pp_Var2[-3]) =
       vtt[2];
  iVar5 = 0;
  iVar6 = 0;
  if (driver != (IVideoDriver *)0x0) {
    iVar6 = (*driver->_vptr_IVideoDriver[0x3b])(driver);
    iVar5 = (int)*(undefined8 *)CONCAT44(extraout_var,iVar6);
    iVar6 = (int)((ulong)*(undefined8 *)CONCAT44(extraout_var,iVar6) >> 0x20);
  }
  local_40.UpperLeftCorner.X = 0;
  local_40.UpperLeftCorner.Y = 0;
  local_40.LowerRightCorner.Y = iVar6;
  local_40.LowerRightCorner.X = iVar5;
  IGUIElement::IGUIElement
            ((IGUIElement *)&(this->super_IGUIEnvironment).field_0x8,vtt + 3,EGUIET_ROOT,
             (IGUIEnvironment *)0x0,(IGUIElement *)0x0,0,&local_40);
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IGUIEnvironment)._vptr_IGUIEnvironment = pp_Var2;
  *(void **)((long)&(this->super_IGUIEnvironment)._vptr_IGUIEnvironment + (long)pp_Var2[-3]) =
       vtt[5];
  *(void **)&(this->super_IGUIEnvironment).field_0x8 = vtt[6];
  (this->Fonts).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Fonts).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Fonts).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Fonts).is_sorted = true;
  (this->Banks).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Banks).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Banks).m_data.
  super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Banks).is_sorted = true;
  this->Driver = driver;
  this->Hovered = (IGUIElement *)0x0;
  this->HoveredNoSubelement = (IGUIElement *)0x0;
  this->Focus = (IGUIElement *)0x0;
  (this->LastHoveredMousePos).X = 0;
  (this->LastHoveredMousePos).Y = 0;
  this->CurrentSkin = (IGUISkin *)0x0;
  this->FileSystem = fs;
  this->UserReceiver = (IEventReceiver *)0x0;
  this->Operator = op;
  this->FocusFlags = 9;
  (this->DeletionQueue).m_data.
  super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->DeletionQueue).m_data.
  super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->DeletionQueue).m_data.
  super__Vector_base<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DeletionQueue).is_sorted = true;
  if (driver != (IVideoDriver *)0x0) {
    *(int *)(&driver->field_0x10 + (long)driver->_vptr_IVideoDriver[-3]) =
         *(int *)(&driver->field_0x10 + (long)driver->_vptr_IVideoDriver[-3]) + 1;
  }
  if (fs != (IFileSystem *)0x0) {
    *(int *)(&fs->field_0x10 + (long)fs->_vptr_IFileSystem[-3]) =
         *(int *)(&fs->field_0x10 + (long)fs->_vptr_IFileSystem[-3]) + 1;
  }
  if (op != (IOSOperator *)0x0) {
    *(int *)(&op->field_0x10 + (long)op->_vptr_IOSOperator[-3]) =
         *(int *)(&op->field_0x10 + (long)op->_vptr_IOSOperator[-3]) + 1;
  }
  loadBuiltInFont(this);
  iVar5 = (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0xe])(this,1);
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar5);
  (*(this->super_IGUIEnvironment)._vptr_IGUIEnvironment[0xd])(this,plVar4);
  lVar3 = *(long *)(*plVar4 + -0x18);
  piVar1 = (int *)((long)plVar4 + lVar3 + 0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    plVar4 = (long *)((long)plVar4 + lVar3);
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  (this->ToolTip).LastTime = 0;
  (this->ToolTip).EnterTime = 0;
  (this->ToolTip).LaunchTime = 1000;
  (this->ToolTip).RelaunchTime = 500;
  (this->ToolTip).Element = (IGUIStaticText *)0x0;
  *(CGUIEnvironment **)&this->field_0x130 = this;
  this->field_0x11c = 1;
  return;
}

Assistant:

CGUIEnvironment::CGUIEnvironment(io::IFileSystem *fs, video::IVideoDriver *driver, IOSOperator *op) :
		IGUIElement(EGUIET_ROOT, 0, 0, 0, core::rect<s32>(driver ? core::dimension2d<s32>(driver->getScreenSize()) : core::dimension2d<s32>(0, 0))),
		Driver(driver), Hovered(0), HoveredNoSubelement(0), Focus(0), LastHoveredMousePos(0, 0), CurrentSkin(0),
		FileSystem(fs), UserReceiver(0), Operator(op), FocusFlags(EFF_SET_ON_LMOUSE_DOWN | EFF_SET_ON_TAB)
{
	if (Driver)
		Driver->grab();

	if (FileSystem)
		FileSystem->grab();

	if (Operator)
		Operator->grab();

#ifdef _DEBUG
	IGUIEnvironment::setDebugName("CGUIEnvironment");
#endif

	loadBuiltInFont();

	IGUISkin *skin = createSkin(gui::EGST_WINDOWS_METALLIC);
	setSkin(skin);
	skin->drop();

	// set tooltip default
	ToolTip.LastTime = 0;
	ToolTip.EnterTime = 0;
	ToolTip.LaunchTime = 1000;
	ToolTip.RelaunchTime = 500;
	ToolTip.Element = 0;

	// environment is root tab group
	Environment = this;
	setTabGroup(true);
}